

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

uint anon_unknown.dwarf_181bf::filterX<unsigned_int>
               (TypedImageChannel<unsigned_int> *channel,int w,double x,int y,Extrapolation ext)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  TypedImageChannel<unsigned_int> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  int w_00;
  
  w_00 = (int)((ulong)in_RDI >> 0x20);
  dVar1 = sampleX<unsigned_int>
                    (unaff_retaddr,w_00,(double)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_XMM0_Qa >> 0x20),(Extrapolation)in_XMM0_Qa);
  dVar2 = sampleX<unsigned_int>
                    (unaff_retaddr,w_00,(double)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_XMM0_Qa >> 0x20),(Extrapolation)in_XMM0_Qa);
  dVar3 = sampleX<unsigned_int>
                    (unaff_retaddr,w_00,(double)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_XMM0_Qa >> 0x20),(Extrapolation)in_XMM0_Qa);
  dVar4 = sampleX<unsigned_int>
                    (unaff_retaddr,w_00,(double)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_XMM0_Qa >> 0x20),(Extrapolation)in_XMM0_Qa);
  return (uint)(long)(dVar4 * 0.125 + dVar3 * 0.375 + dVar1 * 0.125 + dVar2 * 0.375);
}

Assistant:

T
filterX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Horizontal four-tap filter, centered on pixel (x + 0.5, y)
    //

    return T (
        0.125 * sampleX (channel, w, x - 1, y, ext) +
        0.375 * sampleX (channel, w, x, y, ext) +
        0.375 * sampleX (channel, w, x + 1, y, ext) +
        0.125 * sampleX (channel, w, x + 2, y, ext));
}